

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmac_drbg.c
# Opt level: O1

int mbedtls_hmac_drbg_update_seed_file(mbedtls_hmac_drbg_context *ctx,char *path)

{
  int iVar1;
  FILE *__stream;
  ulong __n;
  size_t sVar2;
  uchar buf [256];
  uchar auStack_138 [264];
  
  __stream = fopen(path,"rb");
  iVar1 = -7;
  if (__stream != (FILE *)0x0) {
    fseek(__stream,0,2);
    __n = ftell(__stream);
    fseek(__stream,0,0);
    if (__n < 0x101) {
      sVar2 = fread(auStack_138,1,__n,__stream);
      fclose(__stream);
      if (sVar2 == __n) {
        mbedtls_hmac_drbg_update(ctx,auStack_138,__n);
        iVar1 = mbedtls_hmac_drbg_write_seed_file(ctx,path);
      }
    }
    else {
      fclose(__stream);
      iVar1 = -5;
    }
  }
  return iVar1;
}

Assistant:

int mbedtls_hmac_drbg_update_seed_file( mbedtls_hmac_drbg_context *ctx, const char *path )
{
    FILE *f;
    size_t n;
    unsigned char buf[ MBEDTLS_HMAC_DRBG_MAX_INPUT ];

    if( ( f = fopen( path, "rb" ) ) == NULL )
        return( MBEDTLS_ERR_HMAC_DRBG_FILE_IO_ERROR );

    fseek( f, 0, SEEK_END );
    n = (size_t) ftell( f );
    fseek( f, 0, SEEK_SET );

    if( n > MBEDTLS_HMAC_DRBG_MAX_INPUT )
    {
        fclose( f );
        return( MBEDTLS_ERR_HMAC_DRBG_INPUT_TOO_BIG );
    }

    if( fread( buf, 1, n, f ) != n )
    {
        fclose( f );
        return( MBEDTLS_ERR_HMAC_DRBG_FILE_IO_ERROR );
    }

    fclose( f );

    mbedtls_hmac_drbg_update( ctx, buf, n );

    return( mbedtls_hmac_drbg_write_seed_file( ctx, path ) );
}